

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderCommonFunctionTests.cpp
# Opt level: O2

ostream * deqp::gles31::Functional::operator<<(ostream *str,HexBool *v)

{
  ostream *poVar1;
  char *pcVar2;
  Hex<8UL> hex;
  
  pcVar2 = "true";
  if (v->value == 0) {
    pcVar2 = "false";
  }
  poVar1 = std::operator<<(str,pcVar2);
  poVar1 = std::operator<<(poVar1," / ");
  hex.value._4_4_ = 0;
  hex.value._0_4_ = v->value;
  poVar1 = tcu::Format::operator<<(poVar1,hex);
  return poVar1;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const HexBool& v)
{
	return str << (v.value ? "true" : "false") << " / " << tcu::toHex(v.value);
}